

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O2

void BrotliStoreHuffmanTree
               (uint8_t *depths,size_t num,HuffmanTree *tree,size_t *storage_ix,uint8_t *storage)

{
  byte bVar1;
  byte bVar2;
  size_t sVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  uint8_t code_length_bitdepth [18];
  size_t huffman_tree_size;
  uint32_t huffman_tree_histogram [18];
  uint16_t code_length_bitdepth_symbols [18];
  uint8_t huffman_tree [704];
  uint8_t huffman_tree_extra_bits [704];
  
  huffman_tree_size = 0;
  code_length_bitdepth[0x10] = '\0';
  code_length_bitdepth[0x11] = '\0';
  code_length_bitdepth[0] = '\0';
  code_length_bitdepth[1] = '\0';
  code_length_bitdepth[2] = '\0';
  code_length_bitdepth[3] = '\0';
  code_length_bitdepth[4] = '\0';
  code_length_bitdepth[5] = '\0';
  code_length_bitdepth[6] = '\0';
  code_length_bitdepth[7] = '\0';
  code_length_bitdepth[8] = '\0';
  code_length_bitdepth[9] = '\0';
  code_length_bitdepth[10] = '\0';
  code_length_bitdepth[0xb] = '\0';
  code_length_bitdepth[0xc] = '\0';
  code_length_bitdepth[0xd] = '\0';
  code_length_bitdepth[0xe] = '\0';
  code_length_bitdepth[0xf] = '\0';
  huffman_tree_histogram[0xc] = 0;
  huffman_tree_histogram[0xd] = 0;
  huffman_tree_histogram[0xe] = 0;
  huffman_tree_histogram[0xf] = 0;
  huffman_tree_histogram[8] = 0;
  huffman_tree_histogram[9] = 0;
  huffman_tree_histogram[10] = 0;
  huffman_tree_histogram[0xb] = 0;
  huffman_tree_histogram[4] = 0;
  huffman_tree_histogram[5] = 0;
  huffman_tree_histogram[6] = 0;
  huffman_tree_histogram[7] = 0;
  huffman_tree_histogram[0] = 0;
  huffman_tree_histogram[1] = 0;
  huffman_tree_histogram[2] = 0;
  huffman_tree_histogram[3] = 0;
  huffman_tree_histogram[0x10] = 0;
  huffman_tree_histogram[0x11] = 0;
  BrotliWriteHuffmanTree(depths,num,&huffman_tree_size,huffman_tree,huffman_tree_extra_bits);
  for (sVar3 = 0; huffman_tree_size != sVar3; sVar3 = sVar3 + 1) {
    huffman_tree_histogram[huffman_tree[sVar3]] = huffman_tree_histogram[huffman_tree[sVar3]] + 1;
  }
  uVar7 = 0;
  lVar6 = 0;
  for (lVar4 = 0; lVar4 != 0x12; lVar4 = lVar4 + 1) {
    lVar8 = lVar6;
    if ((huffman_tree_histogram[lVar4] != 0) &&
       (bVar11 = uVar7 != 0, uVar7 = 1, lVar8 = lVar4, bVar11)) {
      uVar7 = 2;
      break;
    }
    lVar6 = lVar8;
  }
  uVar10 = 0x12;
  BrotliCreateHuffmanTree(huffman_tree_histogram,0x12,5,tree,code_length_bitdepth);
  BrotliConvertBitDepthsToSymbols(code_length_bitdepth,0x12,code_length_bitdepth_symbols);
  if (1 < uVar7) {
    uVar10 = 0x12;
    do {
      if (code_length_bitdepth[*(byte *)((long)kStaticDistanceCodeBits + uVar10 + 0x7f)] != '\0')
      goto LAB_0011d363;
      uVar10 = uVar10 - 1;
    } while (uVar10 != 0);
    uVar10 = 0;
  }
LAB_0011d363:
  uVar9 = (ulong)(code_length_bitdepth[3] == '\0') + 2;
  if (code_length_bitdepth[2] != '\0' || code_length_bitdepth[1] != '\0') {
    uVar9 = 0;
  }
  uVar5 = *storage_ix;
  *(ulong *)(storage + (uVar5 >> 3)) = uVar9 << ((byte)uVar5 & 7) | (ulong)storage[uVar5 >> 3];
  uVar5 = uVar5 + 2;
  *storage_ix = uVar5;
  for (; uVar9 < uVar10; uVar9 = uVar9 + 1) {
    bVar1 = *(byte *)((long)&
                            BrotliStoreHuffmanTreeOfHuffmanTreeToBitMask_kHuffmanBitLengthHuffmanCodeBitLengths
                     + (ulong)code_length_bitdepth
                              [(byte)(&BrotliStoreHuffmanTreeOfHuffmanTreeToBitMask_kStorageOrder)
                                     [uVar9]]);
    *(ulong *)(storage + (uVar5 >> 3)) =
         (ulong)*(byte *)((long)&
                                BrotliStoreHuffmanTreeOfHuffmanTreeToBitMask_kHuffmanBitLengthHuffmanCodeSymbols
                         + (ulong)code_length_bitdepth
                                  [(byte)(&
                                         BrotliStoreHuffmanTreeOfHuffmanTreeToBitMask_kStorageOrder)
                                         [uVar9]]) << ((byte)uVar5 & 7) | (ulong)storage[uVar5 >> 3]
    ;
    uVar5 = uVar5 + bVar1;
    *storage_ix = uVar5;
  }
  if (uVar7 == 1) {
    code_length_bitdepth[lVar6] = '\0';
  }
  for (sVar3 = 0; huffman_tree_size != sVar3; sVar3 = sVar3 + 1) {
    bVar1 = huffman_tree[sVar3];
    bVar2 = (byte)uVar5;
    uVar10 = uVar5 >> 3;
    uVar5 = code_length_bitdepth[bVar1] + uVar5;
    *(ulong *)(storage + uVar10) =
         (ulong)code_length_bitdepth_symbols[bVar1] << (bVar2 & 7) | (ulong)storage[uVar10];
    *storage_ix = uVar5;
    lVar6 = 2;
    if ((bVar1 == 0x10) || (lVar6 = 3, bVar1 == 0x11)) {
      *(ulong *)(storage + (uVar5 >> 3)) =
           (ulong)huffman_tree_extra_bits[sVar3] << ((byte)uVar5 & 7) | (ulong)storage[uVar5 >> 3];
      uVar5 = uVar5 + lVar6;
      *storage_ix = uVar5;
    }
  }
  return;
}

Assistant:

void BrotliStoreHuffmanTree(const uint8_t* depths, size_t num,
                            HuffmanTree* tree,
                            size_t* storage_ix, uint8_t* storage) {
  /* Write the Huffman tree into the brotli-representation.
     The command alphabet is the largest, so this allocation will fit all
     alphabets. */
  uint8_t huffman_tree[BROTLI_NUM_COMMAND_SYMBOLS];
  uint8_t huffman_tree_extra_bits[BROTLI_NUM_COMMAND_SYMBOLS];
  size_t huffman_tree_size = 0;
  uint8_t code_length_bitdepth[BROTLI_CODE_LENGTH_CODES] = { 0 };
  uint16_t code_length_bitdepth_symbols[BROTLI_CODE_LENGTH_CODES];
  uint32_t huffman_tree_histogram[BROTLI_CODE_LENGTH_CODES] = { 0 };
  size_t i;
  int num_codes = 0;
  size_t code = 0;

  BROTLI_DCHECK(num <= BROTLI_NUM_COMMAND_SYMBOLS);

  BrotliWriteHuffmanTree(depths, num, &huffman_tree_size, huffman_tree,
                         huffman_tree_extra_bits);

  /* Calculate the statistics of the Huffman tree in brotli-representation. */
  for (i = 0; i < huffman_tree_size; ++i) {
    ++huffman_tree_histogram[huffman_tree[i]];
  }

  for (i = 0; i < BROTLI_CODE_LENGTH_CODES; ++i) {
    if (huffman_tree_histogram[i]) {
      if (num_codes == 0) {
        code = i;
        num_codes = 1;
      } else if (num_codes == 1) {
        num_codes = 2;
        break;
      }
    }
  }

  /* Calculate another Huffman tree to use for compressing both the
     earlier Huffman tree with. */
  BrotliCreateHuffmanTree(huffman_tree_histogram, BROTLI_CODE_LENGTH_CODES,
                          5, tree, code_length_bitdepth);
  BrotliConvertBitDepthsToSymbols(code_length_bitdepth,
                                  BROTLI_CODE_LENGTH_CODES,
                                  code_length_bitdepth_symbols);

  /* Now, we have all the data, let's start storing it */
  BrotliStoreHuffmanTreeOfHuffmanTreeToBitMask(num_codes, code_length_bitdepth,
                                               storage_ix, storage);

  if (num_codes == 1) {
    code_length_bitdepth[code] = 0;
  }

  /* Store the real Huffman tree now. */
  BrotliStoreHuffmanTreeToBitMask(huffman_tree_size,
                                  huffman_tree,
                                  huffman_tree_extra_bits,
                                  code_length_bitdepth,
                                  code_length_bitdepth_symbols,
                                  storage_ix, storage);
}